

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O1

int speex_resampler_magic
              (SpeexResamplerState *st,uint channel_index,spx_word16_t **out,uint out_len)

{
  spx_word16_t *psVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint tmp_in_len;
  uint local_38;
  uint local_34;
  
  local_38 = st->magic_samples[channel_index];
  uVar4 = st->mem_alloc_size * channel_index;
  psVar1 = st->mem;
  uVar5 = st->filt_len;
  local_34 = out_len;
  speex_resampler_process_native(st,channel_index,&local_38,*out,&local_34);
  uVar2 = st->magic_samples[channel_index] - local_38;
  st->magic_samples[channel_index] = uVar2;
  if (uVar2 != 0) {
    uVar3 = (ulong)uVar2;
    uVar5 = uVar5 - 1;
    do {
      psVar1[(ulong)uVar4 + (ulong)uVar5] = psVar1[(ulong)uVar4 + (ulong)(local_38 + uVar5)];
      uVar5 = uVar5 + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  *out = *out + st->out_stride * local_34;
  return local_34;
}

Assistant:

static int speex_resampler_magic(SpeexResamplerState *st, spx_uint32_t channel_index, spx_word16_t **out, spx_uint32_t out_len) {
   spx_uint32_t tmp_in_len = st->magic_samples[channel_index];
   spx_word16_t *mem = st->mem + channel_index * st->mem_alloc_size;
   const int N = st->filt_len;

   speex_resampler_process_native(st, channel_index, &tmp_in_len, *out, &out_len);

   st->magic_samples[channel_index] -= tmp_in_len;

   /* If we couldn't process all "magic" input samples, save the rest for next time */
   if (st->magic_samples[channel_index])
   {
      spx_uint32_t i;
      for (i=0;i<st->magic_samples[channel_index];i++)
         mem[N-1+i]=mem[N-1+i+tmp_in_len];
   }
   *out += out_len*st->out_stride;
   return out_len;
}